

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pizza_cutter.cpp
# Opt level: O3

optional<pizza_slice> * __thiscall
pizza_cutter::create_slice_for
          (optional<pizza_slice> *__return_storage_ptr__,pizza_cutter *this,int row,int col)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  pointer pvVar4;
  byte bVar5;
  byte bVar6;
  undefined4 in_register_00000014;
  ulong uVar7;
  pointer pvVar8;
  long lVar9;
  pizza_slice ps;
  pizza_slice ps_00;
  ulong local_58;
  int local_40;
  int local_3c;
  pointer local_38;
  
  local_58 = CONCAT44(in_register_00000014,row);
  uVar7 = (ulong)(uint)col;
  if (*(int *)(*(long *)&(this->pizza_).
                         super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[row].
                         super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>._M_impl.
                         super__Vector_impl_data + 4 + (long)col * 8) == -1) {
    iVar1 = this->max_total_;
    iVar2 = this->min_each_;
    pvVar8 = (pointer)CONCAT44(col,row);
    do {
      uVar7 = local_58 & 0xffffffff | uVar7 << 0x20;
      bVar5 = 1;
      bVar6 = 0;
      lVar9 = 0;
      do {
        ps._8_8_ = pvVar8;
        ps.row1 = (int)uVar7;
        ps.col1 = (int)(uVar7 >> 0x20);
        extend_slice(__return_storage_ptr__,this,ps,
                     *(direction *)((long)directions._M_elems + lVar9));
        if ((__return_storage_ptr__->super__Optional_base<pizza_slice,_true,_true>)._M_payload.
            super__Optional_payload_base<pizza_slice>._M_engaged == true) {
          uVar3 = *(ulong *)&(__return_storage_ptr__->super__Optional_base<pizza_slice,_true,_true>)
                             ._M_payload.super__Optional_payload_base<pizza_slice>._M_payload;
          pvVar4 = *(pointer *)
                    ((long)&(__return_storage_ptr__->super__Optional_base<pizza_slice,_true,_true>).
                            _M_payload.super__Optional_payload_base<pizza_slice>._M_payload + 8);
          ps_00.row2 = (int)uVar3;
          ps_00.col2 = (int)(uVar3 >> 0x20);
          ps_00._0_8_ = this;
          count_ingredients((pizza_cutter *)&local_40,ps_00);
          if (local_40 + local_3c <= iVar1) {
            if (iVar2 <= local_3c && iVar2 <= local_40) {
              return __return_storage_ptr__;
            }
            bVar5 = 0;
            local_58 = uVar3;
            local_38 = pvVar4;
          }
          bVar6 = 1;
        }
        lVar9 = lVar9 + 4;
      } while (lVar9 != 0x10);
      uVar7 = local_58 >> 0x20;
      pvVar8 = local_38;
    } while (!(bool)(~bVar6 & 1 | bVar5));
  }
  (__return_storage_ptr__->super__Optional_base<pizza_slice,_true,_true>)._M_payload.
  super__Optional_payload_base<pizza_slice>._M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

std::optional<pizza_slice> pizza_cutter::create_slice_for(int row, int col) const noexcept
{
    if (pizza_[row][col].owner != -1) return std::nullopt;

    pizza_slice slice{row, col, row, col};

    bool look_for_next = true;
    while (look_for_next) {
        bool could_be_extended = false;
        bool all_is_too_large = true;

        pizza_slice candidate;
        for (auto d : directions) {
            auto new_slice = extend_slice(slice, d);

            if (new_slice) {
                could_be_extended = true;
                auto [mushrooms, tomatoes] = count_ingredients(new_slice.value());

                if (is_too_large(mushrooms, tomatoes))
                    continue;

                all_is_too_large = false;

                if (is_minimum_ingredients(mushrooms, tomatoes))
                    return new_slice;

                candidate = new_slice.value();
            }
        }
        slice = candidate;
        look_for_next = could_be_extended && !all_is_too_large;
    }

    return std::nullopt;
}